

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  int iVar1;
  coda_type *local_90;
  char local_88 [8];
  char s2 [21];
  char local_68 [8];
  char s1 [21];
  ulong local_48;
  int64_t bit_size;
  int64_t read_size;
  int64_t bit_offset;
  coda_type *type;
  long dst_size_local;
  char *dst_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_90 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_90 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  bit_offset = (int64_t)local_90;
  read_size = cursor->stack[cursor->n + -1].bit_offset;
  bit_size = 0;
  type = (coda_type *)dst_size;
  dst_size_local = (long)dst;
  dst_local = (char *)cursor;
  if (local_90->bit_size < 0) {
    iVar1 = coda_bin_cursor_get_bit_size(cursor,(int64_t *)&local_48);
    if (iVar1 != 0) {
      return -1;
    }
    if ((long)local_48 < 0) {
      coda_str64(local_48,local_68);
      coda_str64(*(long *)(dst_local + (long)(*(int *)(dst_local + 8) + -1) * 0x18 + 0x20) >> 3,
                 local_88);
      coda_set_error(-300,
                     "possible product error detected (invalid bit size (%s) for binary string - byte:bit offset = %s:%d)"
                     ,local_68,local_88,
                     (ulong)((uint)*(undefined8 *)
                                    (dst_local + (long)(*(int *)(dst_local + 8) + -1) * 0x18 + 0x20)
                            & 7));
      return -1;
    }
    if ((local_48 & 7) != 0) {
      coda_set_error(-300,"product error detected (text does not have a rounded byte size)");
      return -1;
    }
  }
  else {
    local_48 = local_90->bit_size;
  }
  bit_size = (long)local_48 >> 3;
  if ((long)type < bit_size + 1) {
    bit_size = (long)&type[-1].attributes + 7;
  }
  if (bit_size < 1) {
    *(undefined1 *)dst_size_local = 0;
  }
  else {
    iVar1 = read_bits(*(coda_product **)dst_local,read_size,bit_size << 3,(uint8_t *)dst_size_local)
    ;
    if (iVar1 != 0) {
      return -1;
    }
    *(undefined1 *)(dst_size_local + bit_size) = 0;
  }
  return 0;
}

Assistant:

int coda_bin_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_bin_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if (bit_size < 0)
        {
            char s1[21];
            char s2[21];

            coda_str64(bit_size, s1);
            coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s2);
            coda_set_error(CODA_ERROR_PRODUCT,
                           "possible product error detected (invalid bit size (%s) for binary string - "
                           "byte:bit offset = %s:%d)", s1, s2, (int)(cursor->stack[cursor->n - 1].bit_offset & 0x7));
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bits(cursor->product, bit_offset, 8 * read_size, (uint8_t *)dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}